

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

bool CheckWildcards(char *pattern,char *text)

{
  char *text_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  
  if (text == (char *)0x0 || pattern == (char *)0x0) {
    return true;
  }
  do {
    do {
      while (pcVar5 = pattern, cVar4 = *pcVar5, cVar4 != '*') {
        if (cVar4 != '?') {
          if (cVar4 == '\0') {
            return *text == '\0';
          }
          iVar2 = tolower((int)cVar4);
          iVar3 = tolower((int)*text);
          if (iVar2 != iVar3) {
            return false;
          }
        }
        text = text + 1;
        pattern = pcVar5 + 1;
      }
      pattern = pcVar5 + 1;
      cVar4 = *text;
    } while (cVar4 == '\0');
    iVar2 = tolower((int)*pattern);
    text_00 = text;
    do {
      text = text_00 + 1;
      iVar3 = tolower((int)cVar4);
      if (iVar3 == (char)iVar2) {
        bVar1 = CheckWildcards(pattern,text_00);
        pattern = pcVar5;
        if (bVar1) {
          return true;
        }
        break;
      }
      cVar4 = *text;
      text_00 = text;
    } while (cVar4 != '\0');
  } while( true );
}

Assistant:

bool CheckWildcards (const char *pattern, const char *text)
{
	if (pattern == NULL || text == NULL)
		return true;

	while (*pattern)
	{
		if (*pattern == '*')
		{
			char stop = tolower (*++pattern);
			while (*text && tolower(*text) != stop)
			{
				text++;
			}
			if (*text && tolower(*text) == stop)
			{
				if (CheckWildcards (pattern, text++))
				{
					return true;
				}
				pattern--;
			}
		}
		else if (*pattern == '?' || tolower(*pattern) == tolower(*text))
		{
			pattern++;
			text++;
		}
		else
		{
			return false;
		}
	}
	return (*pattern | *text) == 0;
}